

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::(anonymous_namespace)::DescriptorDatabaseTest_ConflictingExtensionError_Test::
~DescriptorDatabaseTest_ConflictingExtensionError_Test
          (DescriptorDatabaseTest_ConflictingExtensionError_Test *this)

{
  protobuf::anon_unknown_0::DescriptorDatabaseTest_ConflictingExtensionError_Test::
  ~DescriptorDatabaseTest_ConflictingExtensionError_Test
            ((DescriptorDatabaseTest_ConflictingExtensionError_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, ConflictingExtensionError) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "extension { name:\"foo\" label:LABEL_OPTIONAL type:TYPE_INT32 number:5 "
      "            extendee: \".Foo\" }");
  AddToDatabaseWithError(
      "name: \"bar.proto\" "
      "extension { name:\"bar\" label:LABEL_OPTIONAL type:TYPE_INT32 number:5 "
      "            extendee: \".Foo\" }");
}